

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O3

void __thiscall
dg::pta::PointerAnalysisFI::PointerAnalysisFI
          (PointerAnalysisFI *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  _Rb_tree_header *p_Var1;
  type tVar2;
  _Base_ptr p_Var3;
  size_t *psVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  size_type __n;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_60;
  undefined8 local_30;
  size_t sStack_28;
  
  tVar2 = (opts->super_AnalysisOptions).fieldSensitivity.offset;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&local_60,&(opts->super_AnalysisOptions).allocationFunctions._M_t);
  local_30._0_1_ = opts->preprocessGeps;
  local_30._1_1_ = opts->invalidateNodes;
  local_30._2_6_ = *(undefined6 *)&opts->field_0x3a;
  sStack_28 = opts->maxIterations;
  (this->super_PointerAnalysis)._vptr_PointerAnalysis = (_func_int **)&PTR__PointerAnalysis_0011a9b8
  ;
  (this->super_PointerAnalysis).to_process.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PointerAnalysis).to_process.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PointerAnalysis).to_process.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PointerAnalysis).changed.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PointerAnalysis).changed.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PointerAnalysis).changed.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PointerAnalysis).PG = ps;
  (this->super_PointerAnalysis).options.super_AnalysisOptions.fieldSensitivity.offset = tVar2;
  p_Var3 = &(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
            _M_impl.super__Rb_tree_header._M_header;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    *(_Base_ptr *)
     ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
             _M_impl.super__Rb_tree_header + 8) = (_Base_ptr)0x0;
    psVar4 = (size_t *)
             ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions
                     ._M_t._M_impl.super__Rb_tree_header + 0x20);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    p_Var6 = p_Var3;
  }
  else {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    *(_Base_ptr *)
     ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
             _M_impl.super__Rb_tree_header + 8) =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
    psVar4 = &local_60._M_impl.super__Rb_tree_header._M_node_count;
    *(size_t *)
     ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
             _M_impl.super__Rb_tree_header + 0x20) =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  *(_Base_ptr *)
   ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
           _M_impl.super__Rb_tree_header + 0x10) = p_Var3;
  *(_Base_ptr *)
   ((long)&(this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t.
           _M_impl.super__Rb_tree_header + 0x18) = p_Var6;
  *psVar4 = 0;
  (this->super_PointerAnalysis).options.super_AnalysisOptions.allocationFunctions._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color =
       local_60._M_impl.super__Rb_tree_header._M_header._M_color;
  (this->super_PointerAnalysis).options.preprocessGeps = (bool)(undefined1)local_30;
  (this->super_PointerAnalysis).options.invalidateNodes = (bool)local_30._1_1_;
  *(undefined6 *)&(this->super_PointerAnalysis).options.field_0x3a = local_30._2_6_;
  (this->super_PointerAnalysis).options.maxIterations = sStack_28;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&local_60,(_Link_type)0x0);
  (this->super_PointerAnalysis)._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFI_0011aa98;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_objects).
  super__Vector_base<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = (ulong)(((long)(ps->_globals).
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(ps->_globals).
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) +
                 ((long)(ps->nodes).
                        super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(ps->nodes).
                        super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) / 100;
  __n = 8;
  if (8 < uVar5) {
    __n = uVar5;
  }
  std::
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ::reserve(&this->memory_objects,__n);
  return;
}

Assistant:

PointerAnalysisFI(PointerGraph *ps, const PointerAnalysisOptions &opts)
            : PointerAnalysis(ps, opts) {
        memory_objects.reserve(
                std::max(ps->size() / 100, static_cast<size_t>(8)));
    }